

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::start_lsd(session_impl *this)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<libtorrent::aux::listen_socket_t> *s;
  pointer psVar3;
  bool bVar4;
  error_code ec;
  address local_58;
  alert_manager *local_38;
  
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = &this->m_alerts;
  for (psVar3 = (this->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((((peVar2->flags).m_val & 8) == 0) &&
       ((peVar2->lsd).super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      bVar4 = (peVar2->local_endpoint).impl_.data_.base.sa_family != 2;
      if (bVar4) {
        local_58.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 8);
        local_58.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 0x10);
        local_58.ipv6_address_.scope_id_ =
             (unsigned_long)(peVar2->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_58.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(peVar2->local_endpoint).impl_.data_.v4.sin_addr.s_addr;
        local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_58.ipv6_address_.scope_id_ = 0;
      }
      local_58.type_ = (anon_enum_32)bVar4;
      ::std::
      make_shared<libtorrent::aux::lsd,boost::asio::io_context&,libtorrent::aux::session_impl&,boost::asio::ip::address,boost::asio::ip::address&>
                ((io_context *)&ec,(session_impl *)this->m_io_context,(address *)this,&local_58);
      ::std::__shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((psVar3->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->lsd).
                  super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2> *)&ec);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec.cat_);
      ec.val_ = 0;
      ec.failed_ = false;
      ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                 super_error_category;
      lsd::start((((psVar3->
                   super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->lsd).
                 super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&ec);
      if (ec.failed_ == true) {
        if (((this->m_alerts).m_alert_mask._M_i.m_val & 1) != 0) {
          peVar2 = (psVar3->
                   super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          bVar4 = (peVar2->local_endpoint).impl_.data_.base.sa_family != 2;
          if (bVar4) {
            local_58.ipv6_address_.addr_.__in6_u._0_8_ =
                 *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 8);
            local_58.ipv6_address_.addr_.__in6_u._8_8_ =
                 *(undefined8 *)((long)&(peVar2->local_endpoint).impl_.data_ + 0x10);
            local_58.ipv6_address_.scope_id_ =
                 (unsigned_long)(peVar2->local_endpoint).impl_.data_.v6.sin6_scope_id;
            local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
          }
          else {
            local_58.ipv4_address_.addr_.s_addr =
                 (in4_addr_type)(peVar2->local_endpoint).impl_.data_.v4.sin_addr.s_addr;
            local_58.ipv6_address_.addr_.__in6_u._0_8_ = 0;
            local_58.ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_58.ipv6_address_.scope_id_ = 0;
          }
          local_58.type_ = (anon_enum_32)bVar4;
          alert_manager::
          emplace_alert<libtorrent::lsd_error_alert,boost::system::error_code&,boost::asio::ip::address>
                    (local_38,&ec,&local_58);
        }
        ::std::__shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&(((psVar3->
                      super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->lsd).
                    super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>);
      }
    }
  }
  return;
}

Assistant:

void session_impl::start_lsd()
	{
		INVARIANT_CHECK;

		for (auto& s : m_listen_sockets)
		{
			// we're not looking for local peers when we're using a proxy. We
			// want all traffic to go through the proxy
			if (s->flags & listen_socket_t::proxy) continue;
			if (s->lsd) continue;
			s->lsd = std::make_shared<lsd>(m_io_context, *this, s->local_endpoint.address()
				, s->netmask);
			error_code ec;
			s->lsd->start(ec);
			if (ec)
			{
				if (m_alerts.should_post<lsd_error_alert>())
					m_alerts.emplace_alert<lsd_error_alert>(ec, s->local_endpoint.address());
				s->lsd.reset();
			}
		}
	}